

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

void av1_adjust_gf_refresh_qp_one_pass_rt(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  AV1_PRIMARY *pAVar3;
  uint i;
  int iVar4;
  long lVar5;
  _Bool _Var6;
  uint uVar7;
  
  pAVar3 = cpi->ppi;
  iVar1 = (cpi->resize_pending_params).width;
  if ((iVar1 != 0) && (iVar2 = (cpi->resize_pending_params).height, iVar2 != 0)) {
    if ((cpi->common).width != iVar1) {
      return;
    }
    if ((cpi->common).height != iVar2) {
      return;
    }
  }
  if ((cpi->rc).high_source_sad != 0) {
    return;
  }
  iVar1 = (pAVar3->p_rc).avg_frame_qindex[1];
  iVar2 = (cpi->rc).frames_till_gf_update_due;
  if (iVar2 == 1 &&
      (cpi->common).current_frame.frame_number - (cpi->rc).frame_num_last_gf_refresh < 0x50) {
    iVar4 = 0;
    _Var6 = false;
    if (iVar1 < (cpi->common).quant_params.base_qindex) goto LAB_00208982;
  }
  if ((pAVar3->p_rc).baseline_gf_interval + -10 < iVar2) {
    return;
  }
  _Var6 = true;
  iVar4 = 1;
  if (((iVar1 * 0x57) / 100 <= (cpi->common).quant_params.base_qindex) &&
     (iVar1 = (cpi->rc).avg_frame_low_motion, 0x13 < iVar1 || iVar1 == 0)) {
    return;
  }
LAB_00208982:
  (pAVar3->rtc_ref).refresh[(pAVar3->rtc_ref).gld_idx_1layer] = iVar4;
  (cpi->refresh_frame).golden_frame = _Var6;
  set_baseline_gf_interval(cpi,'\x01');
  lVar5 = 0;
  uVar7 = 0;
  do {
    iVar1 = (pAVar3->rtc_ref).ref_idx[lVar5];
    uVar7 = uVar7 | (pAVar3->rtc_ref).refresh[iVar1] << ((byte)iVar1 & 0x1f);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 7);
  (cpi->common).current_frame.refresh_frame_flags = uVar7;
  return;
}

Assistant:

void av1_adjust_gf_refresh_qp_one_pass_rt(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;
  RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  const int resize_pending = is_frame_resize_pending(cpi);
  if (!resize_pending && !rc->high_source_sad) {
    // Check if we should disable GF refresh (if period is up),
    // or force a GF refresh update (if we are at least halfway through
    // period) based on QP. Look into add info on segment deltaq.
    PRIMARY_RATE_CONTROL *p_rc = &cpi->ppi->p_rc;
    const int avg_qp = p_rc->avg_frame_qindex[INTER_FRAME];
    const int allow_gf_update =
        rc->frames_till_gf_update_due <= (p_rc->baseline_gf_interval - 10);
    int gf_update_changed = 0;
    int thresh = 87;
    if ((cm->current_frame.frame_number - cpi->rc.frame_num_last_gf_refresh) <
            FIXED_GF_INTERVAL_RT &&
        rc->frames_till_gf_update_due == 1 &&
        cm->quant_params.base_qindex > avg_qp) {
      // Disable GF refresh since QP is above the running average QP.
      rtc_ref->refresh[rtc_ref->gld_idx_1layer] = 0;
      gf_update_changed = 1;
      cpi->refresh_frame.golden_frame = 0;
    } else if (allow_gf_update &&
               ((cm->quant_params.base_qindex < thresh * avg_qp / 100) ||
                (rc->avg_frame_low_motion && rc->avg_frame_low_motion < 20))) {
      // Force refresh since QP is well below average QP or this is a high
      // motion frame.
      rtc_ref->refresh[rtc_ref->gld_idx_1layer] = 1;
      gf_update_changed = 1;
      cpi->refresh_frame.golden_frame = 1;
    }
    if (gf_update_changed) {
      set_baseline_gf_interval(cpi, INTER_FRAME);
      int refresh_mask = 0;
      for (unsigned int i = 0; i < INTER_REFS_PER_FRAME; i++) {
        int ref_frame_map_idx = rtc_ref->ref_idx[i];
        refresh_mask |= rtc_ref->refresh[ref_frame_map_idx]
                        << ref_frame_map_idx;
      }
      cm->current_frame.refresh_frame_flags = refresh_mask;
    }
  }
}